

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O1

void xmlXPtrStartPointFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathObjectType xVar1;
  int *piVar2;
  int *piVar3;
  xmlNodePtr node;
  bool bVar4;
  xmlXPathObjectPtr pxVar5;
  xmlXPathObjectPtr pxVar6;
  xmlLocationSetPtr obj;
  long lVar7;
  int error;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs != 1) {
    error = 0xc;
    goto LAB_001eee74;
  }
  if (ctxt->valueNr <= ctxt->valueFrame) {
    error = 0x17;
    goto LAB_001eee74;
  }
  if ((ctxt->value == (xmlXPathObjectPtr)0x0) ||
     ((xVar1 = ctxt->value->type, xVar1 != XPATH_NODESET && (xVar1 != XPATH_LOCATIONSET)))) {
    error = 0xb;
    goto LAB_001eee74;
  }
  pxVar5 = valuePop(ctxt);
  pxVar6 = pxVar5;
  if (pxVar5->type == XPATH_NODESET) {
    pxVar6 = xmlXPtrNewLocationSetNodeSet(pxVar5->nodesetval);
    xmlXPathFreeObject(pxVar5);
    if (pxVar6 != (xmlXPathObjectPtr)0x0) goto LAB_001eed03;
  }
  else {
LAB_001eed03:
    obj = (xmlLocationSetPtr)(*xmlMalloc)(0x10);
    if (obj == (xmlLocationSetPtr)0x0) {
      xmlXPtrErrMemory("allocating locationset");
      obj = (xmlLocationSetPtr)0x0;
    }
    else {
      obj->locNr = 0;
      obj->locMax = 0;
      obj->locTab = (xmlXPathObjectPtr *)0x0;
    }
    if (obj != (xmlLocationSetPtr)0x0) {
      piVar2 = (int *)pxVar6->user;
      if ((piVar2 != (int *)0x0) && (0 < *piVar2)) {
        lVar7 = 0;
        do {
          piVar3 = *(int **)(*(long *)(piVar2 + 2) + lVar7 * 8);
          if (piVar3 != (int *)0x0) {
            if (*piVar3 == 6) {
              node = *(xmlNodePtr *)(piVar3 + 10);
              bVar4 = true;
              if (node == (xmlNodePtr)0x0) {
                pxVar5 = (xmlXPathObjectPtr)0x0;
              }
              else if ((node->type | XML_ATTRIBUTE_DECL) == XML_NAMESPACE_DECL) {
                xmlXPathFreeObject(pxVar6);
                xmlXPtrFreeLocationSet(obj);
                xmlXPathErr(ctxt,0x10);
                pxVar5 = (xmlXPathObjectPtr)0x0;
                bVar4 = false;
              }
              else {
                pxVar5 = xmlXPtrNewPoint(node,piVar3[0xc]);
              }
              if (!bVar4) {
                return;
              }
            }
            else if (*piVar3 == 5) {
              pxVar5 = xmlXPtrNewPoint(*(xmlNodePtr *)(piVar3 + 10),piVar3[0xc]);
            }
            else {
              pxVar5 = (xmlXPathObjectPtr)0x0;
            }
            if (pxVar5 != (xmlXPathObjectPtr)0x0) {
              xmlXPtrLocationSetAdd(obj,pxVar5);
            }
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < *piVar2);
      }
      xmlXPathFreeObject(pxVar6);
      pxVar6 = (xmlXPathObjectPtr)(*xmlMalloc)(0x48);
      if (pxVar6 == (xmlXPathObjectPtr)0x0) {
        xmlXPtrErrMemory("allocating locationset");
        pxVar6 = (xmlXPathObjectPtr)0x0;
      }
      else {
        *(undefined8 *)pxVar6 = 0;
        pxVar6->nodesetval = (xmlNodeSetPtr)0x0;
        pxVar6->stringval = (xmlChar *)0x0;
        pxVar6->user = (void *)0x0;
        *(undefined8 *)&pxVar6->index = 0;
        pxVar6->user2 = (void *)0x0;
        *(undefined8 *)&pxVar6->boolval = 0;
        pxVar6->floatval = 0.0;
        *(undefined8 *)&pxVar6->index2 = 0;
        pxVar6->type = XPATH_LOCATIONSET;
        pxVar6->user = obj;
      }
      valuePush(ctxt,pxVar6);
      return;
    }
    xmlXPathFreeObject(pxVar6);
  }
  error = 0xf;
LAB_001eee74:
  xmlXPathErr(ctxt,error);
  return;
}

Assistant:

static void
xmlXPtrStartPointFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr tmp, obj, point;
    xmlLocationSetPtr newset = NULL;
    xmlLocationSetPtr oldset = NULL;

    CHECK_ARITY(1);
    if ((ctxt->value == NULL) ||
	((ctxt->value->type != XPATH_LOCATIONSET) &&
	 (ctxt->value->type != XPATH_NODESET)))
        XP_ERROR(XPATH_INVALID_TYPE)

    obj = valuePop(ctxt);
    if (obj->type == XPATH_NODESET) {
	/*
	 * First convert to a location set
	 */
	tmp = xmlXPtrNewLocationSetNodeSet(obj->nodesetval);
	xmlXPathFreeObject(obj);
	if (tmp == NULL)
            XP_ERROR(XPATH_MEMORY_ERROR)
	obj = tmp;
    }

    newset = xmlXPtrLocationSetCreate(NULL);
    if (newset == NULL) {
	xmlXPathFreeObject(obj);
        XP_ERROR(XPATH_MEMORY_ERROR);
    }
    oldset = (xmlLocationSetPtr) obj->user;
    if (oldset != NULL) {
	int i;

	for (i = 0; i < oldset->locNr; i++) {
	    tmp = oldset->locTab[i];
	    if (tmp == NULL)
		continue;
	    point = NULL;
	    switch (tmp->type) {
		case XPATH_POINT:
		    point = xmlXPtrNewPoint(tmp->user, tmp->index);
		    break;
		case XPATH_RANGE: {
		    xmlNodePtr node = tmp->user;
		    if (node != NULL) {
			if ((node->type == XML_ATTRIBUTE_NODE) ||
                            (node->type == XML_NAMESPACE_DECL)) {
			    xmlXPathFreeObject(obj);
			    xmlXPtrFreeLocationSet(newset);
			    XP_ERROR(XPTR_SYNTAX_ERROR);
			}
			point = xmlXPtrNewPoint(node, tmp->index);
		    }
		    break;
	        }
		default:
		    /*** Should we raise an error ?
		    xmlXPathFreeObject(obj);
		    xmlXPathFreeObject(newset);
		    XP_ERROR(XPATH_INVALID_TYPE)
		    ***/
		    break;
	    }
            if (point != NULL)
		xmlXPtrLocationSetAdd(newset, point);
	}
    }
    xmlXPathFreeObject(obj);
    valuePush(ctxt, xmlXPtrWrapLocationSet(newset));
}